

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O1

PageMemoryData * MemoryProfiler::GetPageMemoryData(PageAllocatorType type)

{
  bool bVar1;
  PageMemoryData *pPVar2;
  MemoryProfiler *pMVar3;
  
  bVar1 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)Js::Configuration::Global,TraceMemoryFlag);
  pPVar2 = (PageMemoryData *)0x0;
  if ((type != PageAllocatorType_Max) && (bVar1)) {
    pMVar3 = EnsureMemoryProfiler();
    pPVar2 = pMVar3->pageMemoryData + type;
  }
  return pPVar2;
}

Assistant:

PageMemoryData *
MemoryProfiler::GetPageMemoryData(PageAllocatorType type)
{
    if (!Js::Configuration::Global.flags.IsEnabled(Js::TraceMemoryFlag))
    {
        return nullptr;
    }
    if (type == PageAllocatorType_Max)
    {
        return nullptr;
    }
    MemoryProfiler * memoryProfiler = EnsureMemoryProfiler();
    return &memoryProfiler->pageMemoryData[type];
}